

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::CovergroupDeclarationSyntax::getChild(CovergroupDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff58;
  Info *in_stack_ffffffffffffff60;
  nullptr_t in_stack_ffffffffffffff68;
  ConstTokenOrSyntax *in_stack_ffffffffffffff70;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 1:
    token.info = in_stack_ffffffffffffff60;
    token._0_8_ = in_stack_ffffffffffffff58;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x38637e,token);
    break;
  case 2:
    token_00.info = in_stack_ffffffffffffff60;
    token_00._0_8_ = in_stack_ffffffffffffff58;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3863b4,token_00);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff60;
    token_01._0_8_ = in_stack_ffffffffffffff58;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3863e4,token_01);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 5:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 6:
    token_02.info = in_stack_ffffffffffffff60;
    token_02._0_8_ = in_stack_ffffffffffffff58;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x386450,token_02);
    break;
  case 7:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0xa0),in_stack_ffffffffffffff58);
    break;
  case 8:
    token_03.info = in_stack_ffffffffffffff60;
    token_03._0_8_ = in_stack_ffffffffffffff58;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x3864c3,token_03);
    break;
  case 9:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax CovergroupDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return covergroup;
        case 2: return extends;
        case 3: return name;
        case 4: return portList;
        case 5: return event;
        case 6: return semi;
        case 7: return &members;
        case 8: return endgroup;
        case 9: return endBlockName;
        default: return nullptr;
    }
}